

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview_p.h
# Opt level: O1

bool __thiscall QListViewPrivate::hasRectForIndex(QListViewPrivate *this,QModelIndex *index)

{
  QPersistentModelIndex *this_00;
  int iVar1;
  QAbstractItemModel *pQVar2;
  Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
  *this_01;
  Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *this_02;
  char cVar3;
  Node<QPersistentModelIndex,_QHashDummyValue> *pNVar4;
  long in_FS_OFFSET;
  bool bVar5;
  bool bVar6;
  Bucket BVar7;
  QModelIndex local_90;
  QModelIndex local_78;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((-1 < index->r) && (-1 < index->c)) &&
     ((index->m).ptr == (this->super_QAbstractItemViewPrivate).model)) {
    pQVar2 = (index->m).ptr;
    if (pQVar2 == (QAbstractItemModel *)0x0) {
      local_90.r = -1;
      local_90.c = -1;
      local_90.i = 0;
      local_90.m.ptr = (QAbstractItemModel *)0x0;
    }
    else {
      (**(code **)(*(long *)pQVar2 + 0x68))(&local_90,pQVar2,index);
    }
    this_00 = &(this->super_QAbstractItemViewPrivate).root;
    cVar3 = comparesEqual(this_00,&local_90);
    if ((cVar3 != '\0') && (index->c == this->column)) {
      iVar1 = index->r;
      local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
      pQVar2 = (this->super_QAbstractItemViewPrivate).model;
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,this_00);
      bVar5 = false;
      (**(code **)(*(long *)pQVar2 + 0x60))(&local_78,pQVar2,iVar1,0,&local_58);
      local_58.m.ptr = local_78.m.ptr;
      local_58.r = local_78.r;
      local_58.c = local_78.c;
      local_58.i = local_78.i;
      this_01 = *(Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                  **)(*(long *)((this->super_QAbstractItemViewPrivate).model + 8) + 0x90);
      if (this_01 !=
          (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
           *)0x0) {
        BVar7 = QHashPrivate::
                Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                ::findBucket<QtPrivate::QModelIndexWrapper>(this_01,(QModelIndexWrapper *)&local_58)
        ;
        if (BVar7.span[BVar7.index] == (Span)0xff) {
          bVar5 = false;
        }
        else {
          bVar5 = *(long *)(BVar7.span + 0x80) != 0;
        }
      }
      bVar6 = true;
      if (bVar5) {
        QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_58,&local_78);
        this_02 = (this->hiddenRows).q_hash.d;
        if (this_02 != (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0) {
          pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
                   findNode<QPersistentModelIndex>(this_02,(QPersistentModelIndex *)&local_58);
          bVar6 = pNVar4 == (Node<QPersistentModelIndex,_QHashDummyValue> *)0x0;
        }
      }
      if (bVar5) {
        QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_58);
      }
      goto LAB_00581513;
    }
  }
  bVar6 = false;
LAB_00581513:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

inline bool hasRectForIndex(const QModelIndex &index) const
    {
        return isIndexValid(index) && index.parent() == root && index.column() == column && !isHidden(index.row());
    }